

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameToIdentifiers<wabt::Event>
               (vector<wabt::Event_*,_std::allocator<wabt::Event_*>_> *things,BindingHash *bh,
               set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
               *filter)

{
  pointer ppEVar1;
  Index i;
  pointer ppEVar2;
  
  ppEVar1 = (things->super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  i = 0;
  for (ppEVar2 = (things->super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>)._M_impl
                 .super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1) {
    RenameToIdentifier(&(*ppEVar2)->name,i,bh,filter);
    i = i + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things, BindingHash& bh,
                         const std::set<string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}